

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_utxo.cpp
# Opt level: O1

vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> * __thiscall
cfd::CoinSelection::SelectCoinsMinConf
          (vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *__return_storage_ptr__,CoinSelection *this
          ,int64_t *target_value,vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_> *utxos,
          UtxoFilter *filter,CoinSelectionOption *option_params,Amount *tx_fee_value,
          bool consider_fee,int64_t *select_value,Amount *utxo_fee_value,bool *searched_bnb)

{
  uint64_t uVar1;
  Utxo *pUVar2;
  long lVar3;
  pointer pUVar4;
  bool bVar5;
  ulong uVar6;
  uint64_t uVar7;
  int64_t iVar8;
  uint64_t min_change;
  CfdException *this_00;
  ulong uVar9;
  pointer __args;
  bool ignore_error;
  Utxo **utxo;
  pointer ppUVar10;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *__return_storage_ptr___00;
  ulong uVar11;
  Amount AVar12;
  FeeCalculator effective_fee;
  vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_> utxo_pool;
  undefined1 local_c8 [8];
  int local_c0;
  char *local_b8 [2];
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *local_a8;
  int64_t need_value;
  FeeCalculator long_term_fee;
  int64_t search_value;
  FeeCalculator discard_fee;
  Amount local_78;
  long *local_68;
  int64_t find_value;
  vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_> work_utxos;
  
  local_68 = target_value;
  if (select_value == (int64_t *)0x0) {
    local_c8 = (undefined1  [8])0x5f0a3e;
    local_c0 = 0x1cd;
    local_b8[0] = "SelectCoinsMinConf";
    work_utxos.super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)filter;
    core::logger::log<void_const*&>
              ((CfdSourceLocation *)local_c8,kCfdLogLevelInfo,"select_value=null, filter={}",
               (void **)&work_utxos);
  }
  else {
    *select_value = 0;
  }
  if (searched_bnb != (bool *)0x0) {
    *searched_bnb = false;
  }
  std::vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>::vector(&work_utxos,utxos);
  FeeCalculator::FeeCalculator(&effective_fee,option_params->effective_fee_baserate_);
  FeeCalculator::FeeCalculator(&discard_fee,10000);
  AVar12 = core::Amount::CreateBySatoshiAmount(0);
  local_78.amount_ = AVar12.amount_;
  local_78.ignore_check_ = AVar12.ignore_check_;
  uVar1 = option_params->effective_fee_baserate_;
  if (uVar1 != 0) {
    AVar12 = FeeCalculator::GetFee(&discard_fee,option_params->change_spend_size_);
    local_c8 = (undefined1  [8])AVar12.amount_;
    local_c0 = CONCAT31(local_c0._1_3_,AVar12.ignore_check_);
    AVar12 = FeeCalculator::GetFee(&effective_fee,option_params->change_output_size_);
    utxo_pool.super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)AVar12.amount_;
    utxo_pool.super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)CONCAT71(utxo_pool.super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>.
                           _M_impl.super__Vector_impl_data._M_finish._1_7_,AVar12.ignore_check_);
    AVar12 = core::operator+((Amount *)local_c8,(Amount *)&utxo_pool);
    local_78.amount_ = AVar12.amount_;
    local_78.ignore_check_ = AVar12.ignore_check_;
  }
  utxo_pool.super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  utxo_pool.super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  utxo_pool.super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8 = __return_storage_ptr__;
  if ((this->use_bnb_ == true) && (option_params->use_bnb_ == true)) {
    FeeCalculator::FeeCalculator(&long_term_fee,option_params->long_term_fee_baserate_);
    ppUVar10 = work_utxos.super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
    ignore_error = false;
    for (__args = work_utxos.super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>._M_impl.
                  super__Vector_impl_data._M_start; __args != ppUVar10; __args = __args + 1) {
      pUVar2 = *__args;
      bVar5 = ignore_error;
      if (pUVar2 != (Utxo *)0x0) {
        pUVar2->effective_value = 0;
        pUVar2->fee = 0;
        pUVar2->long_term_fee = 0;
        AVar12 = FeeCalculator::GetFee(&effective_fee,*__args);
        local_c8 = (undefined1  [8])AVar12.amount_;
        local_c0 = CONCAT31(local_c0._1_3_,AVar12.ignore_check_);
        uVar6 = core::Amount::GetSatoshiValue((Amount *)local_c8);
        uVar11 = (*__args)->amount;
        bVar5 = true;
        if (!consider_fee || uVar6 < uVar11) {
          if (uVar1 != 0) {
            uVar9 = uVar6;
            if (!consider_fee) {
              uVar9 = 0;
            }
            (*__args)->fee = uVar6;
            AVar12 = FeeCalculator::GetFee(&long_term_fee,*__args);
            local_c8 = (undefined1  [8])AVar12.amount_;
            local_c0 = CONCAT31(local_c0._1_3_,AVar12.ignore_check_);
            uVar7 = core::Amount::GetSatoshiValue((Amount *)local_c8);
            uVar11 = uVar11 - uVar9;
            (*__args)->long_term_fee = uVar7;
          }
          pUVar2 = *__args;
          if (pUVar2->fee < pUVar2->long_term_fee) {
            pUVar2->long_term_fee = pUVar2->fee;
          }
          pUVar2->effective_value = uVar11;
          pUVar2->effective_k_value = uVar11;
          if (utxo_pool.super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              utxo_pool.super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<cfd::Utxo*,std::allocator<cfd::Utxo*>>::_M_realloc_insert<cfd::Utxo*const&>
                      ((vector<cfd::Utxo*,std::allocator<cfd::Utxo*>> *)&utxo_pool,
                       (iterator)
                       utxo_pool.super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish,__args);
            bVar5 = ignore_error;
          }
          else {
            *utxo_pool.super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>._M_impl.
             super__Vector_impl_data._M_finish = pUVar2;
            utxo_pool.super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 utxo_pool.super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
            bVar5 = ignore_error;
          }
        }
      }
      ignore_error = bVar5;
    }
    local_c8 = (undefined1  [8])core::Amount::GetSatoshiValue(&local_78);
    __return_storage_ptr___00 = local_a8;
    SelectCoinsBnB(local_a8,(CoinSelection *)select_value,local_68,&utxo_pool,(int64_t *)local_c8,
                   tx_fee_value,ignore_error,select_value,utxo_fee_value);
    pUVar4 = (__return_storage_ptr___00->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if (pUVar4 != (__return_storage_ptr___00->
                  super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl.
                  super__Vector_impl_data._M_finish) {
      if (searched_bnb != (bool *)0x0) {
        *searched_bnb = true;
      }
      goto LAB_003b9c71;
    }
    if (pUVar4 != (pointer)0x0) {
      operator_delete(pUVar4);
    }
  }
  else {
    ignore_error = false;
  }
  if (utxo_pool.super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      utxo_pool.super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
LAB_003b9a8e:
    if (work_utxos.super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        work_utxos.super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      ppUVar10 = work_utxos.super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      do {
        if (*ppUVar10 != (Utxo *)0x0) {
          if (uVar1 == 0) {
            uVar7 = 0;
          }
          else {
            AVar12 = FeeCalculator::GetFee(&effective_fee,*ppUVar10);
            local_c8 = (undefined1  [8])AVar12.amount_;
            local_c0 = CONCAT31(local_c0._1_3_,AVar12.ignore_check_);
            uVar7 = core::Amount::GetSatoshiValue((Amount *)local_c8);
          }
          (*ppUVar10)->fee = uVar7;
          pUVar2 = *ppUVar10;
          pUVar2->effective_k_value = pUVar2->amount;
          if (consider_fee) {
            pUVar2->effective_k_value = pUVar2->amount - pUVar2->fee;
          }
          if (utxo_pool.super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              utxo_pool.super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<cfd::Utxo*,std::allocator<cfd::Utxo*>>::_M_realloc_insert<cfd::Utxo*const&>
                      ((vector<cfd::Utxo*,std::allocator<cfd::Utxo*>> *)&utxo_pool,
                       (iterator)
                       utxo_pool.super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish,ppUVar10);
          }
          else {
            *utxo_pool.super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>._M_impl.
             super__Vector_impl_data._M_finish = pUVar2;
            utxo_pool.super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 utxo_pool.super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
        ppUVar10 = ppUVar10 + 1;
      } while (ppUVar10 !=
               work_utxos.super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
  }
  else if (ignore_error) {
    if (utxo_pool.super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        utxo_pool.super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      utxo_pool.super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           utxo_pool.super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    goto LAB_003b9a8e;
  }
  lVar3 = *local_68;
  search_value = lVar3;
  AVar12 = core::Amount::CreateBySatoshiAmount(0);
  __return_storage_ptr___00 = local_a8;
  _long_term_fee = AVar12.amount_;
  iVar8 = core::Amount::GetSatoshiValue(tx_fee_value);
  if (0 < iVar8) {
    iVar8 = core::Amount::GetSatoshiValue(tx_fee_value);
    search_value = iVar8 + lVar3;
  }
  uVar7 = option_params->knapsack_minimum_change_;
  min_change = 1000000;
  if (-1 < (long)uVar7) {
    min_change = uVar7;
  }
  if ((-1 < (long)uVar7 && uVar1 != 0) &&
     (iVar8 = core::Amount::GetSatoshiValue(&local_78), min_change = uVar7, (long)uVar7 <= iVar8)) {
    min_change = core::Amount::GetSatoshiValue(&local_78);
  }
  KnapsackSolver(__return_storage_ptr___00,this,&search_value,&utxo_pool,min_change,select_value,
                 (Amount *)&long_term_fee);
  if (uVar1 != 0) {
    find_value = *select_value;
    need_value = search_value;
    iVar8 = core::Amount::GetSatoshiValue((Amount *)&long_term_fee);
    need_value = iVar8 + need_value;
    if (find_value < need_value) {
      local_c8 = (undefined1  [8])0x5f0a3e;
      local_c0 = 0x243;
      local_b8[0] = "SelectCoinsMinConf";
      core::logger::log<long&,long&>
                ((CfdSourceLocation *)local_c8,kCfdLogLevelWarning,
                 "Failed to KnapsackSolver. Not enough utxos.: find_value={}, need_value={}",
                 &find_value,&need_value);
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      local_c8 = (undefined1  [8])local_b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c8,"Failed to KnapsackSolver. Not enough utxos.","");
      core::CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)local_c8);
      __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
  }
  if (utxo_fee_value != (Amount *)0x0) {
    utxo_fee_value->ignore_check_ = AVar12.ignore_check_;
    utxo_fee_value->amount_ = _long_term_fee;
  }
LAB_003b9c71:
  if (utxo_pool.super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(utxo_pool.super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (work_utxos.super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(work_utxos.super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr___00;
}

Assistant:

std::vector<Utxo> CoinSelection::SelectCoinsMinConf(
    const int64_t& target_value, const std::vector<Utxo*>& utxos,
    const UtxoFilter& filter, const CoinSelectionOption& option_params,
    const Amount& tx_fee_value, const bool consider_fee, int64_t* select_value,
    Amount* utxo_fee_value, bool* searched_bnb) {
  // for btc default(DUST_RELAY_TX_FEE(3000)) -> DEFAULT_DISCARD_FEE(10000)
  if (select_value != nullptr) {
    *select_value = 0;
  } else {
    cfd::core::logger::info(
        CFD_LOG_SOURCE, "select_value=null, filter={}",
        static_cast<const void*>(&filter));
    // for unused parameter
  }
  if (searched_bnb != nullptr) *searched_bnb = false;

  // Copy the list to change the calculation area.
  std::vector<Utxo*> work_utxos = utxos;
  FeeCalculator effective_fee(option_params.GetEffectiveFeeBaserate());
  FeeCalculator discard_fee(kDefaultDiscardFee);
  Amount cost_of_change = Amount::CreateBySatoshiAmount(0);
  bool use_fee = false;
  if (option_params.GetEffectiveFeeBaserate() != 0) {
    cost_of_change = discard_fee.GetFee(option_params.GetChangeSpendSize()) +
                     effective_fee.GetFee(option_params.GetChangeOutputSize());
    use_fee = true;
  }

  std::vector<Utxo*> utxo_pool;
  bool ignore_error = false;
  if (use_bnb_ && option_params.IsUseBnB()) {
    // Get long term estimate
    FeeCalculator long_term_fee(option_params.GetLongTermFeeBaserate());

    // NOLINT Filter by the min conf specs and add to utxo_pool and calculate effective value
    for (auto& utxo : work_utxos) {
      if (utxo == nullptr) continue;
      // if (!group.EligibleForSpending(eligibility_filter)) continue;
      utxo->fee = 0;
      utxo->long_term_fee = 0;
      utxo->effective_value = 0;

      uint64_t fee = effective_fee.GetFee(*utxo).GetSatoshiValue();
      // Only include outputs that are positive effective value (i.e. not dust)
      if ((utxo->amount > fee) || (!consider_fee)) {
        uint64_t effective_value = utxo->amount;
        if (use_fee) {
          if (consider_fee) {
            effective_value -= fee;
          }
          utxo->fee = fee;
          utxo->long_term_fee = long_term_fee.GetFee(*utxo).GetSatoshiValue();
        }
#if 0
        std::vector<uint8_t> txid_byte(sizeof(utxo->txid));
        memcpy(txid_byte.data(), utxo->txid, txid_byte.size());
        info(
            CFD_LOG_SOURCE, "utxo({},{}) size={}/{} amount={}/{}/{}",
            Txid(txid_byte).GetHex(), utxo->vout, utxo->uscript_size_max,
            utxo->witness_size_max, utxo->amount, utxo->fee,
            utxo->long_term_fee);
#endif
        if (utxo->long_term_fee > utxo->fee) {
          utxo->long_term_fee = utxo->fee;  // TODO(k-matsuzawa): Check later
        }
        utxo->effective_value = effective_value;
        utxo->effective_k_value = static_cast<int64_t>(effective_value);
        utxo_pool.push_back(utxo);
      } else {
        ignore_error = true;
      }
    }
    // Calculate the fees for things that aren't inputs
    std::vector<Utxo> result = SelectCoinsBnB(
        target_value, utxo_pool, cost_of_change.GetSatoshiValue(),
        tx_fee_value, ignore_error, select_value, utxo_fee_value);
    if (!result.empty()) {
      if (searched_bnb) *searched_bnb = true;
      return result;
    }
    // SelectCoinsBnB fail, go to KnapsackSolver.
  }

  // Filter by the min conf specs and add to utxo_pool
  // TODO(k-matsuzawa): Currently it is not filtered, so there is no need to recreate the Utxo list.  // NOLINT
  // for (const OutputGroup& group : groups) {
  //   if (!group.EligibleForSpending(eligibility_filter)) continue;
  //   utxo_pool.push_back(group);
  // }
  if (utxo_pool.empty() || ignore_error) {
    utxo_pool.clear();
    for (auto& utxo : work_utxos) {
      if (utxo == nullptr) continue;
      utxo->fee =
          (use_fee) ? effective_fee.GetFee(*utxo).GetSatoshiValue() : 0;
      utxo->effective_k_value = static_cast<int64_t>(utxo->amount);
      if (consider_fee) {
        utxo->effective_k_value -= static_cast<int64_t>(utxo->fee);
      }
      utxo_pool.push_back(utxo);
    }
  }
  int64_t search_value = target_value;
  Amount utxo_fee = Amount::CreateBySatoshiAmount(0);
  if (tx_fee_value.GetSatoshiValue() > 0) {
    search_value += tx_fee_value.GetSatoshiValue();
  }

  // using minimum fee
  uint64_t min_change = kMinChange;
  int64_t opt_min_change = option_params.GetKnapsackMinimumChange();
  if (opt_min_change >= 0) {
    if ((!use_fee) || (opt_min_change > cost_of_change.GetSatoshiValue())) {
      min_change = static_cast<uint64_t>(opt_min_change);
    } else if (use_fee) {
      min_change = static_cast<uint64_t>(cost_of_change.GetSatoshiValue());
    }
  }
  std::vector<Utxo> result = KnapsackSolver(
      search_value, utxo_pool, min_change, select_value, &utxo_fee);
  if (use_fee) {
    // Check if the required amount was detected
    // (May be a non-passing route)
    int64_t find_value = *select_value;
    int64_t need_value = search_value;
    need_value += utxo_fee.GetSatoshiValue();
    if (need_value > find_value) {
      warn(
          CFD_LOG_SOURCE,
          "Failed to KnapsackSolver. Not enough utxos."
          ": find_value={}, need_value={}",
          find_value, need_value);
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to KnapsackSolver. Not enough utxos.");
    }
  }
  if (utxo_fee_value != nullptr) {
    *utxo_fee_value = utxo_fee;
  }
  return result;
}